

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL SetFileAttributesA(LPCSTR lpFileName,DWORD dwFileAttributes)

{
  int iVar1;
  PAL_ERROR PVar2;
  void *pvVar3;
  char *lpPath;
  int *piVar4;
  PAL_ERROR *pPVar5;
  BOOL BVar6;
  uint __mode;
  undefined1 local_b8 [8];
  stat stat_data;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00124a54;
  pvVar3 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar3 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  if ((dwFileAttributes & 0x81) == 0) {
    dwFileAttributes = 0;
LAB_00124960:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00124a54;
  }
  else if (dwFileAttributes != 0x80 && (char)dwFileAttributes < '\0') goto LAB_00124960;
  BVar6 = 0;
  if (lpFileName == (LPCSTR)0x0) {
    PVar2 = 2;
LAB_001249de:
    lpPath = (char *)0x0;
LAB_001249e1:
    pPVar5 = (PAL_ERROR *)__errno_location();
    *pPVar5 = PVar2;
  }
  else {
    lpPath = CorUnix::InternalStrdup(lpFileName);
    if (lpPath == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00124a54;
      PVar2 = 8;
      goto LAB_001249de;
    }
    FILEDosToUnixPathA(lpPath);
    iVar1 = stat64(lpPath,(stat64 *)local_b8);
    if (iVar1 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00124a54;
      piVar4 = __errno_location();
      strerror(*piVar4);
LAB_001249b4:
      PVar2 = FILEGetLastErrorFromErrnoAndFilename(lpPath);
      if (PVar2 == 0) {
        BVar6 = 0;
        goto LAB_001249e9;
      }
      goto LAB_001249e1;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00124a54;
    if (((uint)stat_data.st_nlink & 0xc000) == 0) {
      PVar2 = 5;
      goto LAB_001249e1;
    }
    __mode = (uint)stat_data.st_nlink >> 1 & 0x80 | (uint)stat_data.st_nlink;
    if ((dwFileAttributes & 1) != 0) {
      __mode = (uint)stat_data.st_nlink & 0xffffff6d;
    }
    if ((__mode != (uint)stat_data.st_nlink) && (iVar1 = chmod(lpPath,__mode), iVar1 != 0)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00124a54;
      goto LAB_001249b4;
    }
    BVar6 = 1;
  }
LAB_001249e9:
  CorUnix::InternalFree(lpPath);
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar6;
  }
LAB_00124a54:
  abort();
}

Assistant:

BOOL
PALAPI
SetFileAttributesA(
           IN LPCSTR lpFileName,
           IN DWORD dwFileAttributes)
{
    CPalThread *pThread;
    struct stat stat_data;
    mode_t new_mode;

    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;
    LPSTR UnixFileName = NULL;

    PERF_ENTRY(SetFileAttributesA);
    ENTRY("SetFileAttributesA(lpFileName=%p (%s), dwFileAttributes=%#x)\n",
        lpFileName?lpFileName:"NULL",
        lpFileName?lpFileName:"NULL", dwFileAttributes);

    pThread = InternalGetCurrentThread();

    /* Windows behavior for SetFileAttributes is that any valid attributes
    are set on a file and any invalid attributes are ignored. SetFileAttributes 
    returns success and does not set an error even if some or all of the 
    attributes are invalid. If all the attributes are invalid, SetFileAttributes
    sets a file's attribute to NORMAL. */

    /* If dwFileAttributes does not contain READONLY or NORMAL, set it to NORMAL
    and print a warning message. */
    if ( !(dwFileAttributes & (FILE_ATTRIBUTE_READONLY |FILE_ATTRIBUTE_NORMAL)) )
    {
        dwFileAttributes = FILE_ATTRIBUTE_NORMAL;
        WARN("dwFileAttributes(%#x) contains attributes that are either not supported "
            "or cannot be set via SetFileAttributes.\n");
    }
     
    if ( (dwFileAttributes & FILE_ATTRIBUTE_NORMAL) &&
         (dwFileAttributes != FILE_ATTRIBUTE_NORMAL) )
    {
        WARN("Ignoring FILE_ATTRIBUTE_NORMAL -- it must be used alone\n");
    }

    if (lpFileName == NULL)
    {
        dwLastError = ERROR_FILE_NOT_FOUND;
        goto done;
    }

    if ((UnixFileName = InternalStrdup(lpFileName)) == NULL)
    {
        ERROR("InternalStrdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    FILEDosToUnixPathA( UnixFileName );
    if ( stat(UnixFileName, &stat_data) != 0 )
    {
        TRACE("stat failed on %s; errno is %d (%s)\n", 
             UnixFileName, errno, strerror(errno));
        dwLastError = FILEGetLastErrorFromErrnoAndFilename(UnixFileName);
        goto done;
    }

    new_mode = stat_data.st_mode;
    TRACE("st_mode is %#x\n", new_mode);

    /* if we can't do GetFileAttributes on it, don't do SetFileAttributes */
    if ( !(new_mode & S_IFREG) && !(new_mode & S_IFDIR) )
    {
        ERROR("Not a regular file or directory, S_IFMT is %#x\n",
              new_mode & S_IFMT);
        dwLastError = ERROR_ACCESS_DENIED;
        goto done;    
    }

    /* set or unset the "read-only" attribute */
    if (dwFileAttributes & FILE_ATTRIBUTE_READONLY)
    {
        /* remove the write bit from everybody */
        new_mode &= ~(S_IWUSR | S_IWGRP | S_IWOTH);
    }
    else
    {
        /* give write permission to the owner if the owner
         * already has read permission */
        if ( new_mode & S_IRUSR )
        {
            new_mode |= S_IWUSR;
        }
    }
    TRACE("new mode is %#x\n", new_mode);

    bRet = TRUE;
    if ( new_mode != stat_data.st_mode )
    {
        if ( chmod(UnixFileName, new_mode) != 0 )
        {
            ERROR("chmod(%s, %#x) failed\n", UnixFileName, new_mode);
            dwLastError = FILEGetLastErrorFromErrnoAndFilename(UnixFileName);
            bRet = FALSE;
        }
    }

done:
    if (dwLastError)
    {
        pThread->SetLastError(dwLastError);
    }
    
    InternalFree(UnixFileName);

    LOGEXIT("SetFileAttributesA returns BOOL %d\n", bRet);
    PERF_EXIT(SetFileAttributesA);
    return bRet;
}